

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  pointer *this_00;
  cmCTest *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  ostream *poVar6;
  reference pbVar7;
  char *dir_00;
  void *pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  iterator __first;
  iterator __last;
  ulong uVar10;
  mapped_type *this_01;
  reference pvVar11;
  long lVar12;
  size_type sVar13;
  bool collapse;
  string local_3398 [32];
  undefined1 local_3378 [8];
  ostringstream cmCTestLog_msg_25;
  string local_3200 [32];
  undefined1 local_31e0 [8];
  ostringstream cmCTestLog_msg_24;
  value_type_conflict1 local_3068;
  int local_3064;
  string local_3060 [4];
  int lineIdx;
  string lineNumber;
  string local_3038 [4];
  int cov;
  string prefix;
  undefined1 local_2ff8 [8];
  ostringstream cmCTestLog_msg_23;
  undefined1 local_2e80 [8];
  string nl;
  long cnt;
  undefined1 local_2e38 [8];
  ostringstream cmCTestLog_msg_22;
  long local_2cc0;
  ifstream ifile;
  string local_2ab8 [32];
  undefined1 local_2a98 [8];
  ostringstream cmCTestLog_msg_21;
  SingleFileCoverageVector *vec;
  undefined1 local_28f8 [8];
  ostringstream cmCTestLog_msg_20;
  string local_2780 [32];
  undefined1 local_2760 [8];
  ostringstream cmCTestLog_msg_19;
  string local_25e8 [32];
  undefined1 local_25c8 [8];
  ostringstream cmCTestLog_msg_18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2450;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2448;
  iterator t;
  string local_2420 [32];
  undefined1 local_2400 [8];
  ostringstream cmCTestLog_msg_17;
  undefined1 local_2280 [4];
  int success;
  string srcname;
  undefined1 local_2240 [8];
  ostringstream cmCTestLog_msg_16;
  long local_20c8;
  ifstream srcead;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1ec0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1eb8;
  iterator a;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e98;
  const_iterator local_1e90;
  string local_1e88 [32];
  undefined1 local_1e68 [8];
  ostringstream cmCTestLog_msg_15;
  undefined1 local_1cf0 [8];
  string daGlob;
  undefined1 local_1cb0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string dir;
  Glob gl;
  string lcovFile;
  string sourceFile;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1bd0;
  iterator line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_1b90 [8];
  ostringstream cmCTestLog_msg_14;
  string local_1a18 [32];
  undefined1 local_19f8 [8];
  ostringstream cmCTestLog_msg_13;
  string local_1880 [32];
  undefined1 local_1860 [8];
  ostringstream cmCTestLog_msg_12;
  string local_16e8 [32];
  undefined1 local_16c8 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1550 [32];
  undefined1 local_1530 [8];
  ostringstream cmCTestLog_msg_10;
  int local_13b0;
  int res;
  int retVal;
  string errors;
  undefined1 local_1380 [8];
  string output;
  undefined1 local_1340 [8];
  ostringstream cmCTestLog_msg_9;
  string local_11c8 [32];
  undefined1 local_11a8 [8];
  ostringstream cmCTestLog_msg_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  undefined1 local_fd0 [8];
  string command;
  string fileDir;
  undefined1 local_f70 [8];
  ostringstream cmCTestLog_msg_7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_df0;
  undefined1 local_de8 [8];
  cmCTestCoverageHandlerLocale locale_C;
  string local_dc0 [4];
  int file_count;
  undefined1 local_da0 [8];
  ostringstream cmCTestLog_msg_6;
  string local_c28 [32];
  undefined1 local_c08 [8];
  ostringstream cmCTestLog_msg_5;
  allocator local_a89;
  undefined1 local_a88 [8];
  string actualSourceFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  string currentDirectory;
  string tempDir;
  string testingDir;
  undefined1 local_9b8 [8];
  ostringstream cmCTestLog_msg_4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_840;
  iterator it;
  undefined1 local_818 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_6a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_668 [8];
  ostringstream cmCTestLog_msg_2;
  string local_4f0 [32];
  undefined1 local_4d0 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_358 [8];
  RegularExpression st2re3;
  string local_280 [8];
  string st2lcovOutputRex3;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string lcovExtraFlags;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string lcovCommand;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  lcovCommand.field_2._8_8_ = cont;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CoverageCommand",&local_61);
  cmCTest::GetCTestConfiguration((string *)local_40,pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"CoverageExtraFlags",&local_b9);
  cmCTest::GetCTestConfiguration((string *)local_98,pcVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"codecov");
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    poVar6 = std::operator<<((ostream *)local_238," Not a valid Intel Coverage command.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5d3,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    this_local._4_4_ = 0;
    st2lcovOutputRex3.field_2._12_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"[0-9]+%",(allocator *)((long)&st2re3.searchstring + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&st2re3.searchstring + 7));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_358,pcVar5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    poVar6 = std::operator<<((ostream *)local_4d0," This is coverage command: ");
    poVar6 = std::operator<<(poVar6,(string *)local_40);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5dc,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
    poVar6 = std::operator<<((ostream *)local_668," These are coverage command flags: ");
    poVar6 = std::operator<<(poVar6,(string *)local_98);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5e0,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string
              ((string *)
               &files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_6a0);
    bVar3 = FindLCovFiles(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_6a0);
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_840);
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6a0);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b8);
        poVar6 = std::operator<<((ostream *)local_9b8," Cannot find any LCov coverage files.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x5ef,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(testingDir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b8);
        this_local._4_4_ = 0;
        st2lcovOutputRex3.field_2._12_4_ = 1;
      }
      else {
        cmCTest::GetBinaryDir_abi_cxx11_
                  ((string *)((long)&tempDir.field_2 + 8),(this->super_cmCTestGenericHandler).CTest)
        ;
        std::__cxx11::string::string
                  ((string *)(currentDirectory.field_2._M_local_buf + 8),
                   (string *)(tempDir.field_2._M_local_buf + 8));
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (SystemTools *)0x1,collapse);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&actualSourceFile.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_a88,"",&local_a89);
        std::allocator<char>::~allocator((allocator<char> *)&local_a89);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c08);
        poVar6 = std::operator<<((ostream *)local_c08,
                                 "   Processing coverage (each . represents one file):");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x5fc,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_c28);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c08);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_da0);
        std::operator<<((ostream *)local_da0,"    ");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x5fd,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_dc0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_da0);
        locale_C.lc_all.field_2._12_4_ = 0;
        cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale
                  ((cmCTestCoverageHandlerLocale *)local_de8);
        local_df0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6a0);
        local_840._M_current = local_df0;
        while( true ) {
          local_df8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_6a0);
          bVar3 = __gnu_cxx::operator!=(&local_840,&local_df8);
          if (!bVar3) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f70);
          poVar6 = std::operator<<((ostream *)local_f70,".");
          std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x609,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(fileDir.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f70);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_840);
          cmsys::SystemTools::GetFilenamePath((string *)((long)&command.field_2 + 8),pbVar7);
          cmsys::SystemTools::ChangeDirectory((string *)((long)&command.field_2 + 8));
          std::operator+(&local_1030,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_1010,&local_1030,"\" ");
          std::operator+(&local_ff0,&local_1010,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_fd0,&local_ff0," ");
          std::__cxx11::string::~string((string *)&local_ff0);
          std::__cxx11::string::~string((string *)&local_1010);
          std::__cxx11::string::~string((string *)&local_1030);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11a8);
          poVar6 = std::operator<<((ostream *)local_11a8,"Current coverage dir: ");
          poVar6 = std::operator<<(poVar6,(string *)(command.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x610,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_11c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11a8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1340);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          poVar6 = std::operator<<((ostream *)local_1340,pcVar5);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x612,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1340);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_1380,"",(allocator *)(errors.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(errors.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&retVal,"",(allocator *)((long)&res + 3));
          std::allocator<char>::~allocator((allocator<char> *)((long)&res + 3));
          local_13b0 = 0;
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),
                                   "* Run coverage for: ");
          poVar6 = std::operator<<(poVar6,(string *)(command.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Command: ");
          poVar6 = std::operator<<(poVar6,(string *)local_fd0);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          dir_00 = (char *)std::__cxx11::string::c_str();
          bVar3 = cmCTest::RunCommand(pcVar1,pcVar5,(string *)local_1380,(string *)&retVal,
                                      &local_13b0,dir_00,0.0);
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Output: ");
          poVar6 = std::operator<<(poVar6,(string *)local_1380);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Errors: ");
          poVar6 = std::operator<<(poVar6,(string *)&retVal);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          if (bVar3) {
            if (local_13b0 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1860);
              poVar6 = std::operator<<((ostream *)local_1860,"Coverage command returned: ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_13b0);
              poVar6 = std::operator<<(poVar6," while processing: ");
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_840);
              poVar6 = std::operator<<(poVar6,(string *)pbVar7);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x62a,pcVar5,false);
              std::__cxx11::string::~string(local_1880);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1860);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19f8);
              poVar6 = std::operator<<((ostream *)local_19f8,"Command produced error: ");
              pvVar8 = (void *)std::ostream::operator<<(poVar6,*(int *)lcovCommand.field_2._8_8_);
              std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x62c,pcVar5,false);
              std::__cxx11::string::~string(local_1a18);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19f8);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
            poVar6 = std::operator<<((ostream *)local_1b90,
                                     "--------------------------------------------------------------"
                                    );
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,(string *)local_1380);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,
                                     "--------------------------------------------------------------"
                                    );
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x633,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string
                      ((string *)
                       &lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b90);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&line);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::__normal_iterator(&local_1bd0);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Split
                      (pcVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&line);
            local_1bd0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&line);
            while( true ) {
              sourceFile.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&line);
              bVar3 = __gnu_cxx::operator!=
                                (&local_1bd0,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&sourceFile.field_2 + 8));
              if (!bVar3) break;
              std::__cxx11::string::string((string *)(lcovFile.field_2._M_local_buf + 8));
              std::__cxx11::string::string((string *)&gl.ListDirs);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_1bd0);
              std::__cxx11::string::empty();
              cmsys::Glob::Glob((Glob *)((long)&dir.field_2 + 8));
              cmsys::Glob::RecurseOn((Glob *)((long)&dir.field_2 + 8));
              cmsys::Glob::RecurseThroughSymlinksOff((Glob *)((long)&dir.field_2 + 8));
              std::__cxx11::string::string
                        ((string *)
                         &lcovFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1cb0);
              cmCTest::GetBinaryDir_abi_cxx11_
                        ((string *)((long)&daGlob.field_2 + 8),
                         (this->super_cmCTestGenericHandler).CTest);
              this_00 = &lcovFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::operator=
                        ((string *)this_00,(string *)(daGlob.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(daGlob.field_2._M_local_buf + 8));
              std::__cxx11::string::string((string *)local_1cf0);
              std::__cxx11::string::operator=((string *)local_1cf0,(string *)this_00);
              std::__cxx11::string::operator+=((string *)local_1cf0,"/*.LCOV");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e68);
              poVar6 = std::operator<<((ostream *)local_1e68,"   looking for LCOV files in: ");
              poVar6 = std::operator<<(poVar6,(string *)local_1cf0);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x650,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_1e88);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e68);
              cmsys::Glob::FindFiles
                        ((Glob *)((long)&dir.field_2 + 8),(string *)local_1cf0,(GlobMessages *)0x0);
              local_1e98._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1cb0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_1e90,&local_1e98);
              pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&dir.field_2 + 8));
              __first = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin(pvVar9);
              pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&dir.field_2 + 8));
              __last = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(pvVar9);
              a = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_1cb0,local_1e90,__first._M_current,__last._M_current);
              local_1eb8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1cb0);
              while( true ) {
                local_1ec0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1cb0);
                bVar3 = __gnu_cxx::operator!=(&local_1eb8,&local_1ec0);
                if (!bVar3) break;
                pbVar7 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_1eb8);
                std::__cxx11::string::operator=((string *)&gl.ListDirs,(string *)pbVar7);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                std::ifstream::ifstream(&local_20c8,pcVar5,_S_in);
                bVar4 = std::ios::operator!((ios *)((long)&local_20c8 +
                                                   *(long *)(local_20c8 + -0x18)));
                if ((bVar4 & 1) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2240);
                  poVar6 = std::operator<<((ostream *)local_2240,"Cannot open file: ");
                  poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,6,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x65e,pcVar5,false);
                  std::__cxx11::string::~string((string *)(srcname.field_2._M_local_buf + 8));
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2240);
                }
                std::__cxx11::string::string((string *)local_2280);
                bVar3 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&local_20c8,(string *)local_2280,(bool *)0x0,-1);
                if (bVar3) {
                  std::__cxx11::string::substr((ulong)&t,(ulong)local_2280);
                  std::__cxx11::string::operator=((string *)local_2280,(string *)&t);
                  std::__cxx11::string::~string((string *)&t);
                  std::__cxx11::string::operator=
                            ((string *)(lcovFile.field_2._M_local_buf + 8),(string *)local_2280);
                  std::__cxx11::string::operator=((string *)local_a88,(string *)local_2280);
                  local_2448._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1cb0);
                  while( true ) {
                    local_2450._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1cb0);
                    bVar3 = __gnu_cxx::operator!=(&local_2448,&local_2450);
                    if (!bVar3) break;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_25c8);
                    poVar6 = std::operator<<((ostream *)local_25c8,"Found LCOV File: ");
                    pbVar7 = __gnu_cxx::
                             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_2448);
                    poVar6 = std::operator<<(poVar6,(string *)pbVar7);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x674,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1)
                                );
                    std::__cxx11::string::~string(local_25e8);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_25c8);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&local_2448);
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2760);
                  poVar6 = std::operator<<((ostream *)local_2760,"SourceFile: ");
                  poVar6 = std::operator<<(poVar6,(string *)(lcovFile.field_2._M_local_buf + 8));
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x677,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                  std::__cxx11::string::~string(local_2780);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2760);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_28f8);
                  poVar6 = std::operator<<((ostream *)local_28f8,"lCovFile: ");
                  poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x679,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                  std::__cxx11::string::~string((string *)&vec);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_28f8);
                  uVar10 = std::__cxx11::string::empty();
                  if (((uVar10 & 1) == 0) &&
                     (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                    this_01 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)(lcovCommand.field_2._8_8_ + 0x48),
                                           (key_type *)local_a88);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a98);
                    poVar6 = std::operator<<((ostream *)local_2a98,"   in lcovFile: ");
                    poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x682,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1)
                                );
                    std::__cxx11::string::~string(local_2ab8);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a98);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    std::ifstream::ifstream(&local_2cc0,pcVar5,_S_in);
                    bVar4 = std::ios::operator!((ios *)((long)&local_2cc0 +
                                                       *(long *)(local_2cc0 + -0x18)));
                    if ((bVar4 & 1) == 0) {
                      nl.field_2._8_8_ = 0xffffffffffffffff;
                      std::__cxx11::string::string((string *)local_2e80);
                      cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_2cc0,(string *)local_2e80,(bool *)0x0,-1);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2ff8);
                      poVar6 = std::operator<<((ostream *)local_2ff8,"File is ready, start reading."
                                              );
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::ostringstream::str();
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      cmCTest::Log(pcVar1,4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x692,pcVar5,
                                   (bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                      std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2ff8);
                      while (bVar3 = cmsys::SystemTools::GetLineFromStream
                                               ((istream *)&local_2cc0,(string *)local_2e80,
                                                (bool *)0x0,-1), bVar3) {
                        nl.field_2._8_8_ = nl.field_2._8_8_ + 1;
                        uVar10 = std::__cxx11::string::empty();
                        if (((uVar10 & 1) == 0) &&
                           (uVar10 = std::__cxx11::string::size(), 0xb < uVar10)) {
                          std::__cxx11::string::substr((ulong)local_3038,(ulong)local_2e80);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          lineNumber.field_2._12_4_ = atoi(pcVar5);
                          std::__cxx11::string::substr((ulong)local_3060,(ulong)local_2e80);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          local_3064 = atoi(pcVar5);
                          local_3064 = local_3064 + -1;
                          if (-1 < local_3064) {
                            while (sVar13 = std::vector<int,_std::allocator<int>_>::size(this_01),
                                  sVar13 <= (ulong)(long)local_3064) {
                              local_3068 = -1;
                              std::vector<int,_std::allocator<int>_>::push_back(this_01,&local_3068)
                              ;
                            }
                            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                                (this_01,(long)local_3064);
                            if ((*pvVar11 < 0) &&
                               ((0 < (int)lineNumber.field_2._12_4_ ||
                                (lVar12 = std::__cxx11::string::find((char *)local_3038,0xa73b16),
                                lVar12 != -1)))) {
                              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  (this_01,(long)local_3064);
                              *pvVar11 = 0;
                            }
                            uVar2 = lineNumber.field_2._12_4_;
                            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                                (this_01,(long)local_3064);
                            *pvVar11 = uVar2 + *pvVar11;
                          }
                          std::__cxx11::string::~string(local_3060);
                          std::__cxx11::string::~string(local_3038);
                        }
                      }
                      std::__cxx11::string::~string((string *)local_2e80);
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e38);
                      poVar6 = std::operator<<((ostream *)local_2e38,"Cannot open file: ");
                      poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::ostringstream::str();
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      cmCTest::Log(pcVar1,6,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x688,pcVar5,false);
                      std::__cxx11::string::~string((string *)&cnt);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e38);
                    }
                    std::__cxx11::string::operator=((string *)local_a88,"");
                    std::ifstream::~ifstream(&local_2cc0);
                  }
                  st2lcovOutputRex3.field_2._12_4_ = 0;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2400);
                  poVar6 = std::operator<<((ostream *)local_2400,"Error while parsing lcov file \'")
                  ;
                  poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                  poVar6 = std::operator<<(poVar6,"\':");
                  poVar6 = std::operator<<(poVar6," No source file name found!");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,6,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x667,pcVar5,false);
                  std::__cxx11::string::~string(local_2420);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2400);
                  this_local._4_4_ = 0;
                  st2lcovOutputRex3.field_2._12_4_ = 1;
                }
                std::__cxx11::string::~string((string *)local_2280);
                std::ifstream::~ifstream(&local_20c8);
                if (st2lcovOutputRex3.field_2._12_4_ != 0) goto LAB_004fc163;
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_1eb8);
              }
              st2lcovOutputRex3.field_2._12_4_ = 0;
LAB_004fc163:
              std::__cxx11::string::~string((string *)local_1cf0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1cb0);
              std::__cxx11::string::~string
                        ((string *)
                         &lcovFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmsys::Glob::~Glob((Glob *)((long)&dir.field_2 + 8));
              std::__cxx11::string::~string((string *)&gl.ListDirs);
              std::__cxx11::string::~string((string *)(lcovFile.field_2._M_local_buf + 8));
              if (st2lcovOutputRex3.field_2._12_4_ != 0) goto LAB_004fc477;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_1bd0);
            }
            locale_C.lc_all.field_2._12_4_ = locale_C.lc_all.field_2._12_4_ + 1;
            if ((int)locale_C.lc_all.field_2._12_4_ % 0x32 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_31e0);
              poVar6 = std::operator<<((ostream *)local_31e0," processed: ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,locale_C.lc_all.field_2._12_4_);
              poVar6 = std::operator<<(poVar6," out of ");
              sVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6a0);
              pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar13);
              std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x6ce,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_3200);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_31e0);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3378);
              std::operator<<((ostream *)local_3378,"    ");
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x6cf,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_3398);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3378);
            }
            st2lcovOutputRex3.field_2._12_4_ = 0;
LAB_004fc477:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&line);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1530);
            poVar6 = std::operator<<((ostream *)local_1530,"Problem running coverage on file: ");
            pbVar7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_840);
            poVar6 = std::operator<<(poVar6,(string *)pbVar7);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x621,pcVar5,false);
            std::__cxx11::string::~string(local_1550);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1530);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16c8);
            poVar6 = std::operator<<((ostream *)local_16c8,"Command produced error: ");
            poVar6 = std::operator<<(poVar6,(string *)&retVal);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x623,pcVar5,false);
            std::__cxx11::string::~string(local_16e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16c8);
            *(int *)lcovCommand.field_2._8_8_ = *(int *)lcovCommand.field_2._8_8_ + 1;
            st2lcovOutputRex3.field_2._12_4_ = 0x12;
          }
          std::__cxx11::string::~string((string *)&retVal);
          std::__cxx11::string::~string((string *)local_1380);
          std::__cxx11::string::~string((string *)local_fd0);
          std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
          if ((st2lcovOutputRex3.field_2._12_4_ != 0) && (st2lcovOutputRex3.field_2._12_4_ != 0x12))
          goto LAB_004fc544;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_840);
        }
        cmsys::SystemTools::ChangeDirectory
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
        this_local._4_4_ = locale_C.lc_all.field_2._12_4_;
        st2lcovOutputRex3.field_2._12_4_ = 1;
LAB_004fc544:
        cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale
                  ((cmCTestCoverageHandlerLocale *)local_de8);
        std::__cxx11::string::~string((string *)local_a88);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&actualSourceFile.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)(currentDirectory.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(tempDir.field_2._M_local_buf + 8));
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
      std::operator<<((ostream *)local_818,"Error while finding LCov files.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x5e6,pcVar5,false);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
      this_local._4_4_ = 0;
      st2lcovOutputRex3.field_2._12_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6a0);
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_358);
    std::__cxx11::string::~string(local_280);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand
    = this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags
    = this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if ( lcovCommand != "codecov" )
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Not a valid Intel Coverage command."
               << std::endl, this->Quiet);
    return 0;
    }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " This is coverage command: " << lcovCommand
    << std::endl, this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " These are coverage command flags: " << lcovExtraFlags
    << std::endl, this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
    }
  std::vector<std::string>::iterator it;

  if (files.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      " Cannot find any LCov coverage files."
      << std::endl, this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
    }
  std::string testingDir = this->CTest->GetBinaryDir();
  std::string tempDir = testingDir;
  std::string currentDirectory = cmSystemTools::GetCurrentWorkingDirectory();

  std::set<std::string> missingFiles;

  std::string actualSourceFile = "";
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for ( it = files.begin(); it != files.end(); ++ it )
    {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
      this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmSystemTools::ChangeDirectory(fileDir);
    std::string command = "\"" + lcovCommand + "\" " +
      lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Current coverage dir: " << fileDir << std::endl, this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, command.c_str()
      << std::endl, this->Quiet);

    std::string output = "";
    std::string errors = "";
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(command.c_str(), &output, &errors,
                &retVal, fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if ( ! res )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Command produced error: " << errors << std::endl);
      cont->Error ++;
      continue;
      }
    if ( retVal != 0 )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
        << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Command produced error: " << cont->Error << std::endl);
      }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
      << std::endl
      << output << std::endl
      << "--------------------------------------------------------------"
      << std::endl, this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for ( line = lines.begin(); line != lines.end(); ++line)
      {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty())
        {
        // Ignore empty line
        }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for(std::vector<std::string>::iterator a = lcovFiles.begin();
          a != lcovFiles.end(); ++a)
        {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if ( ! srcead )
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open file: "
                     << lcovFile << std::endl);
          }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if ( !success )
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '" << lcovFile << "':"
                     << " No source file name found!" << std::endl);
          return 0;
          }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for(std::vector<std::string>::iterator t = lcovFiles.begin();
            t != lcovFiles.end(); ++t)
          {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
            "Found LCOV File: " << *t << std::endl, this->Quiet);
          }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "SourceFile: "
          << sourceFile << std::endl, this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "lCovFile: "
        << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if ( !lcovFile.empty() && !actualSourceFile.empty() )
          {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec
            = cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
            "   in lcovFile: " << lcovFile << std::endl, this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if ( ! ifile )
            {
            cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open file: "
                       << lcovFile << std::endl);
            }
          else
            {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
              "File is ready, start reading." << std::endl, this->Quiet);
            while ( cmSystemTools::GetLineFromStream(ifile, nl) )
              {
              cnt ++;

              // Skip empty lines
              if (nl.empty())
                {
                continue;
                }

              // Skip unused lines
              if ( nl.size() < 12 )
                {
                continue;
                }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str())-1;
              if ( lineIdx >= 0 )
                {
                while ( vec.size() <= static_cast<size_t>(lineIdx) )
                  {
                  vec.push_back(-1);
                  }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if ( vec[lineIdx] < 0 )
                  {
                  if ( cov > 0 || prefix.find("#") != prefix.npos )
                    {
                    vec[lineIdx] = 0;
                    }
                  }

                vec[lineIdx] += cov;
                }
              }
            }

          actualSourceFile = "";
          }
        }
      }

    file_count++;

    if ( file_count % 50 == 0 )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
        " processed: " << file_count << " out of " << files.size()
        << std::endl, this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
      }
    }

  cmSystemTools::ChangeDirectory(currentDirectory);
  return file_count;
}